

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void ff_ninja(dw_rom *rom)

{
  vpatch(rom,0x1335,0xf,3,0,0x43,2,3,3,3,0,3,0,0x43,3,0x43,2,0x43);
  vpatch(rom,0x1395,0xf,3,0xc,0x43,0xf,0x43,0xe,0x43,0xc,3,0xc,0x43,0xe,3,0xf,3);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x1435,0xf,3,5,3,6,3,7,3,4,3,5,3,8,3,9,3);
  vpatch(rom,0x1495,0xf,3,0x11,3,0x14,3,0x15,3,0x10,3,0x11,3,0x12,3,0x13,3);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x1535,0xf,3,1,0x43,10,3,0xb,3,1,3,1,0x43,0xb,0x43,10,0x43);
  vpatch(rom,0x1595,0xf,3,0xd,0x43,0x16,3,0x17,3,0xd,3,0xd,0x43,0x17,0x43,0x16,0x43);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x1635,0xf,0x43,4,0x43,7,0x43,6,0x43,5,0x43,4,0x43,9,0x43,8,0x43);
  vpatch(rom,0x1695,0xf,0x43,0x10,0x43,0x15,0x43,0x14,0x43,0x11,0x43,0x10,0x43,0x13,0x43,0x12,0x43);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x15,0xf);
  vpatch(rom,0x12300,0x80,7,8,0x10,0x10,0x10,0x17,0x7f,0xc4,7,0xf,0x1f,0x1f,0x1f,0x1e,0x7a,0xff,0xea
         ,0x19,0xd,0xd,0xd,0xea,0xee,0x23,0xee,0xff,0xff,0xff,0xff,0xfe,0x5e,0xff,0x83,0xc1,0xf0,
         0xf8,0x70,8,8,4,0xff,0xff,0x9f,0x9f,0x7f,0xf,0xf,7,0xc1,0x8d,0xd,0x1e,0xf0,0x90,0xe0,0xf0,
         0xff,0xf3,0xf3,0xfe,0xf0,0xf0,0xe0,0xf0,0x57);
  vpatch(rom,0x12400,0x180,0,7,8,0x10,0x10,0x10,0xf,0xf,0,7,0xf,0x1f,0x1f,0x1f,0xf,10,0,0xe1,0x12,8,
         9,9,0x8d,0x3a,0,0xe1,0xf3,0xfb,0xfb,0xfb,0x7f,0xfe,8,7,0xe,8,4,4,8,0xc,0xf,7,0xf,0xf,7,7,
         0xf,0xf,0xfc,0xc,2,0x4e,0x3e,0xe,100,0xfc,0xfc,0xfc,0xfe,0xf2,0xf2,0xfe,0xfc,0xfc,7);
  if ((rom->flags[0xe] & 8) == 0) {
    return;
  }
  set_text(rom,0x7e56,anon_var_dwarf_90e);
  return;
}

Assistant:

static void ff_ninja(dw_rom *rom)
{
    vpatch(rom, 0x01335,   15,  0x03,  0x00,  0x43,  0x02,  0x03,  0x03,  0x03,  0x00,  0x03,  0x00,  0x43,  0x03,  0x43,  0x02,  0x43);
    vpatch(rom, 0x01395,   15,  0x03,  0x0c,  0x43,  0x0f,  0x43,  0x0e,  0x43,  0x0c,  0x03,  0x0c,  0x43,  0x0e,  0x03,  0x0f,  0x03);
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x01435,   15,  0x03,  0x05,  0x03,  0x06,  0x03,  0x07,  0x03,  0x04,  0x03,  0x05,  0x03,  0x08,  0x03,  0x09,  0x03);
    vpatch(rom, 0x01495,   15,  0x03,  0x11,  0x03,  0x14,  0x03,  0x15,  0x03,  0x10,  0x03,  0x11,  0x03,  0x12,  0x03,  0x13,  0x03);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x01535,   15,  0x03,  0x01,  0x43,  0x0a,  0x03,  0x0b,  0x03,  0x01,  0x03,  0x01,  0x43,  0x0b,  0x43,  0x0a,  0x43);
    vpatch(rom, 0x01595,   15,  0x03,  0x0d,  0x43,  0x16,  0x03,  0x17,  0x03,  0x0d,  0x03,  0x0d,  0x43,  0x17,  0x43,  0x16,  0x43);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x01635,   15,  0x43,  0x04,  0x43,  0x07,  0x43,  0x06,  0x43,  0x05,  0x43,  0x04,  0x43,  0x09,  0x43,  0x08,  0x43);
    vpatch(rom, 0x01695,   15,  0x43,  0x10,  0x43,  0x15,  0x43,  0x14,  0x43,  0x11,  0x43,  0x10,  0x43,  0x13,  0x43,  0x12,  0x43);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x15,  0x0f);
    vpatch(rom, 0x12300,  128,  0x07,  0x08,  0x10,  0x10,  0x10,  0x17,  0x7f,  0xc4,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1e,  0x7a,  0xff,  0xea,  0x19,  0x0d,  0x0d,  0x0d,  0xea,  0xee,  0x23,  0xee,  0xff,  0xff,  0xff,  0xff,  0xfe,  0x5e,  0xff,  0x83,  0xc1,  0xf0,  0xf8,  0x70,  0x08,  0x08,  0x04,  0xff,  0xff,  0x9f,  0x9f,  0x7f,  0x0f,  0x0f,  0x07,  0xc1,  0x8d,  0x0d,  0x1e,  0xf0,  0x90,  0xe0,  0xf0,  0xff,  0xf3,  0xf3,  0xfe,  0xf0,  0xf0,  0xe0,  0xf0,  0x57,  0x98,  0xb0,  0xb0,  0xb0,  0x57,  0x77,  0xc4,  0x77,  0xff,  0xff,  0xff,  0xff,  0x7f,  0x7a,  0xff,  0xe0,  0x10,  0x08,  0x08,  0x08,  0xe8,  0xfe,  0x23,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0x78,  0x5e,  0xff,  0x83,  0xb1,  0xb0,  0x78,  0x0f,  0x09,  0x07,  0x0f,  0xff,  0xcf,  0xcf,  0x7f,  0x0f,  0x0f,  0x07,  0x0f,  0xc1,  0x83,  0x0f,  0x1f,  0x0e,  0x10,  0x10,  0x20,  0xff,  0xff,  0xf9,  0xf9,  0xfe,  0xf0,  0xf0,  0xe0);
    vpatch(rom, 0x12400,  384,  0x00,  0x07,  0x08,  0x10,  0x10,  0x10,  0x0f,  0x0f,  0x00,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x0f,  0x0a,  0x00,  0xe1,  0x12,  0x08,  0x09,  0x09,  0x8d,  0x3a,  0x00,  0xe1,  0xf3,  0xfb,  0xfb,  0xfb,  0x7f,  0xfe,  0x08,  0x07,  0x0e,  0x08,  0x04,  0x04,  0x08,  0x0c,  0x0f,  0x07,  0x0f,  0x0f,  0x07,  0x07,  0x0f,  0x0f,  0xfc,  0x0c,  0x02,  0x4e,  0x3e,  0x0e,  0x64,  0xfc,  0xfc,  0xfc,  0xfe,  0xf2,  0xf2,  0xfe,  0xfc,  0xfc,  0x07,  0x08,  0x10,  0x10,  0x10,  0x0f,  0x0f,  0x08,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x0f,  0x0a,  0x0f,  0xe1,  0x12,  0x08,  0x09,  0x09,  0x8d,  0x3a,  0xfc,  0xe1,  0xf3,  0xfb,  0xfb,  0xfb,  0x7f,  0xfe,  0xfc,  0x07,  0x0e,  0x08,  0x08,  0x04,  0x02,  0x02,  0x02,  0x07,  0x0f,  0x0f,  0x0f,  0x07,  0x03,  0x03,  0x03,  0x10,  0x08,  0x88,  0xc8,  0xc8,  0xf0,  0x20,  0x30,  0xf0,  0xf8,  0xf8,  0x38,  0x38,  0xf0,  0xe0,  0xf0,  0x87,  0x48,  0x10,  0x90,  0x90,  0xb1,  0x5c,  0x3f,  0x87,  0xcf,  0xdf,  0xdf,  0xdf,  0xfe,  0x7f,  0x3f,  0xe0,  0x10,  0x08,  0x08,  0x08,  0xf0,  0xf0,  0x10,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0x50,  0xf0,  0x08,  0x10,  0x11,  0x13,  0x13,  0x0f,  0x04,  0x0c,  0x0f,  0x1f,  0x1f,  0x1c,  0x1c,  0x0f,  0x07,  0x0f,  0xe0,  0x70,  0x10,  0x10,  0x20,  0x40,  0x40,  0x40,  0xe0,  0xf0,  0xf0,  0xf0,  0xe0,  0xc0,  0xc0,  0xc0,  0x00,  0x87,  0x48,  0x10,  0x90,  0x90,  0xb1,  0x5c,  0x00,  0x87,  0xcf,  0xdf,  0xdf,  0xdf,  0xfe,  0x7f,  0x00,  0xe0,  0x10,  0x08,  0x08,  0x08,  0xf0,  0xf0,  0x00,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0x50,  0x3f,  0x30,  0x40,  0x72,  0x7c,  0x70,  0x26,  0x3f,  0x3f,  0x3f,  0x7f,  0x4f,  0x4f,  0x7f,  0x3f,  0x3f,  0x10,  0xe0,  0x70,  0x10,  0x20,  0x20,  0x10,  0x30,  0xf0,  0xe0,  0xf0,  0xf0,  0xe0,  0xe0,  0xf0,  0xf0,  0x07,  0x08,  0x10,  0x10,  0x10,  0x10,  0x38,  0x44,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x3f,  0x7f,  0xe0,  0x10,  0x08,  0x08,  0x08,  0x08,  0x1c,  0x22,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xfc,  0xfe,  0x43,  0x50,  0x38,  0x10,  0x10,  0x10,  0x08,  0x04,  0x7f,  0x7f,  0x3f,  0x1f,  0x1f,  0x1f,  0x0f,  0x07,  0xc1,  0x89,  0x9f,  0x4e,  0xf0,  0x90,  0xe0,  0xf0,  0xff,  0xff,  0xf9,  0xfe,  0xf0,  0xf0,  0xe0,  0xf0,  0x07,  0x08,  0x10,  0x10,  0x10,  0x10,  0x38,  0x44,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x3f,  0x7f,  0xe0,  0x10,  0x08,  0x08,  0x08,  0x08,  0x1c,  0x22,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xfc,  0xfe,  0x83,  0x91,  0xf9,  0x72,  0x0f,  0x09,  0x07,  0x0f,  0xff,  0xff,  0x9f,  0x7f,  0x0f,  0x0f,  0x07,  0x0f,  0xc2,  0x0a,  0x1c,  0x08,  0x08,  0x08,  0x10,  0x20,  0xfe,  0xfe,  0xfc,  0xf8,  0xf8,  0xf8,  0xf0,  0xe0);
    ff_spells(rom);
}